

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall
Bstrlib::CBString::findreplacecaseless(CBString *this,CBString *sfind,char *repl,int pos)

{
  int iVar1;
  CBStringException *pCVar2;
  size_t sVar3;
  const_bstring local_110;
  undefined4 local_104;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  int pos_local;
  char *repl_local;
  CBString *sfind_local;
  CBString *this_local;
  
  if (repl == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,"CBString::findreplacecaseless NULL.",&local_81);
    CBStringException::CBStringException((CBStringException *)local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_60);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (repl == (char *)0x0) {
    local_104 = 0;
  }
  else {
    sVar3 = strlen(repl);
    local_104 = (undefined4)sVar3;
  }
  bstr__cppwrapper_exception.msg.field_2._12_4_ = local_104;
  bstr__cppwrapper_exception.msg.field_2._8_4_ = 0xffffffff;
  local_110 = (const_bstring)0x0;
  if (sfind != (CBString *)0x0) {
    local_110 = &sfind->super_tagbstring;
  }
  iVar1 = bfindreplacecaseless
                    (&this->super_tagbstring,local_110,
                     (const_bstring)((long)&bstr__cppwrapper_exception.msg.field_2 + 8),pos);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,"CBString::Failure in findreplacecaseless",&local_e1);
    CBStringException::CBStringException((CBStringException *)local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_c0);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::findreplacecaseless (const CBString& sfind, const char * repl, int pos) {
struct tagbstring t;
	if (NULL == repl) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("findreplacecaseless NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, repl);
	if (BSTR_ERR == bfindreplacecaseless (this, (bstring) &sfind, (bstring) &t, pos)) {
		bstringThrow ("Failure in findreplacecaseless");
	}
}